

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufstream.c
# Opt level: O2

err_t BufWrite(bufstream *p,uint8_t *Data,size_t Size,size_t *Written)

{
  stream *psVar1;
  err_t eVar2;
  ulong __n;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  ulong local_38;
  
  sVar5 = 0;
  do {
    uVar3 = Size - sVar5;
    if (uVar3 == 0) {
      eVar2 = 0;
      sVar5 = Size;
LAB_0011f663:
      if (Written != (size_t *)0x0) {
        *Written = sVar5;
      }
      return eVar2;
    }
    uVar4 = p->WritePos;
    if (0xfff < uVar4) {
      eVar2 = BufFlush(p);
      if (eVar2 != 0) goto LAB_0011f663;
      uVar4 = p->WritePos;
    }
    if ((uVar4 == 0) && (0x1000 < uVar3)) {
      psVar1 = p->Stream;
      local_38 = uVar3;
      if (psVar1 == (stream *)0x0) {
        __assert_fail("(const void*)(p->Stream)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/file/bufstream.c"
                      ,0x6a,"err_t BufWrite(bufstream *, const uint8_t *, size_t, size_t *)");
      }
      eVar2 = (**(code **)((long)(psVar1->Base).VMT + 0x70))(psVar1,Data + sVar5,uVar3,&local_38);
      sVar5 = sVar5 + local_38;
      goto LAB_0011f663;
    }
    __n = 0x1000 - uVar4;
    if (uVar3 < 0x1000 - uVar4) {
      __n = uVar3;
    }
    memcpy(p->Buffer + uVar4,Data + sVar5,__n);
    sVar5 = sVar5 + __n;
    p->WritePos = p->WritePos + __n;
  } while( true );
}

Assistant:

static err_t BufWrite(bufstream* p,const uint8_t* Data,size_t Size,size_t* Written)
{
    err_t Err = ERR_NONE;
    size_t Pos = 0;
    size_t Left;

    while ((Left = (Size - Pos)) > 0)
    {
        if (p->WritePos >= BUFSTREAM_SIZE && (Err = BufFlush(p)) != ERR_NONE)
            break;

        if (!p->WritePos && Left > BUFSTREAM_SIZE)
        {
            Err = Stream_Write(p->Stream,Data+Pos,Left,&Left);
            Pos += Left;
            break;
        }

        if (Left > BUFSTREAM_SIZE - p->WritePos)
            Left = BUFSTREAM_SIZE - p->WritePos;

        memcpy(p->Buffer+p->WritePos,Data+Pos,Left);
        Pos += Left;
        p->WritePos += Left;
    }

    if (Written)
        *Written = Pos;
    return Err;
}